

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O0

int XNVCTRLQueryTargetStringAttribute
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
              char **ptr)

{
  int iVar1;
  uint uVar2;
  XExtDisplayInfo *pXVar3;
  undefined1 *puVar4;
  void *pvVar5;
  undefined4 in_ECX;
  undefined2 in_DX;
  undefined2 in_SI;
  long in_RDI;
  undefined4 in_R8D;
  long *in_R9;
  int slop;
  int numbytes;
  int length;
  int exists;
  xnvCtrlQueryStringAttributeReq *req;
  xnvCtrlQueryStringAttributeReply rep;
  XExtDisplayInfo *info;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  Display *in_stack_ffffffffffffffc0;
  int local_4;
  
  pXVar3 = find_display((Display *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (in_R9 == (long *)0x0) {
    local_4 = 0;
  }
  else if ((pXVar3 == (XExtDisplayInfo *)0x0) || (pXVar3->codes == (XExtCodes *)0x0)) {
    local_4 = 0;
  }
  else if ((pXVar3 == (XExtDisplayInfo *)0x0) || (pXVar3->codes == (XExtCodes *)0x0)) {
    XMissingExtension(in_RDI,nvctrl_extension_name);
    local_4 = 0;
  }
  else {
    XNVCTRLCheckTargetData
              (in_stack_ffffffffffffffc0,
               (XExtDisplayInfo *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (int *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    if (*(long *)(in_RDI + 0x968) != 0) {
      (*(code *)**(undefined8 **)(in_RDI + 0x968))(in_RDI);
    }
    puVar4 = (undefined1 *)_XGetRequest(in_RDI,4,0x10);
    *puVar4 = (char)pXVar3->codes->major_opcode;
    puVar4[1] = 4;
    *(undefined2 *)(puVar4 + 6) = in_SI;
    *(undefined2 *)(puVar4 + 4) = in_DX;
    *(undefined4 *)(puVar4 + 8) = in_ECX;
    *(undefined4 *)(puVar4 + 0xc) = in_R8D;
    iVar1 = _XReply(in_RDI,&stack0xffffffffffffffb0,0);
    if (iVar1 == 0) {
      if (*(long *)(in_RDI + 0x968) != 0) {
        (**(code **)(*(long *)(in_RDI + 0x968) + 8))(in_RDI);
      }
      if (*(long *)(in_RDI + 0xd0) != 0) {
        (**(code **)(in_RDI + 0xd0))(in_RDI);
      }
      local_4 = 0;
    }
    else {
      uVar2 = in_stack_ffffffffffffffbc & 3;
      pvVar5 = malloc((long)(int)in_stack_ffffffffffffffbc);
      *in_R9 = (long)pvVar5;
      if (*in_R9 == 0) {
        _XEatData(in_RDI,(long)in_stack_ffffffffffffffb4);
        if (*(long *)(in_RDI + 0x968) != 0) {
          (**(code **)(*(long *)(in_RDI + 0x968) + 8))(in_RDI);
        }
        if (*(long *)(in_RDI + 0xd0) != 0) {
          (**(code **)(in_RDI + 0xd0))(in_RDI);
        }
        local_4 = 0;
      }
      else {
        _XRead(in_RDI,*in_R9,(long)(int)in_stack_ffffffffffffffbc);
        if (uVar2 != 0) {
          _XEatData(in_RDI,(long)(int)(4 - uVar2));
        }
        if (*(long *)(in_RDI + 0x968) != 0) {
          (**(code **)(*(long *)(in_RDI + 0x968) + 8))(in_RDI);
        }
        local_4 = in_stack_ffffffffffffffb8;
        if (*(long *)(in_RDI + 0xd0) != 0) {
          (**(code **)(in_RDI + 0xd0))(in_RDI);
        }
      }
    }
  }
  return local_4;
}

Assistant:

Bool XNVCTRLQueryTargetStringAttribute (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,
    char **ptr
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryStringAttributeReply rep;
    xnvCtrlQueryStringAttributeReq   *req;
    Bool exists;
    int length, numbytes, slop;

    if (!ptr) return False;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlQueryStringAttribute, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryStringAttribute;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    if (!_XReply (dpy, (xReply *) &rep, 0, False)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    length = rep.length;
    numbytes = rep.n;
    slop = numbytes & 3;
    *ptr = (char *) Xmalloc(numbytes);
    if (! *ptr) {
        _XEatData(dpy, length);
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    } else {
        _XRead(dpy, (char *) *ptr, numbytes);
        if (slop) _XEatData(dpy, 4-slop);
    }
    exists = rep.flags;
    UnlockDisplay (dpy);
    SyncHandle ();
    return exists;
}